

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorTracker.cpp
# Opt level: O0

void ColorTracker::showImg(Mat *img)

{
  _InputArray local_60;
  allocator local_31;
  string local_30 [32];
  Mat *local_10;
  Mat *img_local;
  
  local_10 = img;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"showImg",&local_31);
  cv::_InputArray::_InputArray(&local_60,local_10);
  cv::imshow(local_30,&local_60);
  cv::_InputArray::~_InputArray(&local_60);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cv::waitKey(0);
  cv::destroyAllWindows();
  return;
}

Assistant:

void ColorTracker::showImg(const Mat& img){
    cv::imshow("showImg",img);
    cv::waitKey(0);
    cv::destroyAllWindows();
}